

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

double __thiscall World::getRadianceWithLight(World *this,Vector3 *P,Vector3 *N,Vector3 *O)

{
  int iVar1;
  uchar *in_RCX;
  Vector3 *in_RDX;
  size_t *siglen;
  size_t *siglen_00;
  uchar *in_RDI;
  Vector3 *pVVar2;
  size_t in_R8;
  Collision collision;
  Vector3 L;
  Collision *in_stack_fffffffffffffef0;
  Vector3 *in_stack_fffffffffffffef8;
  Vector3 *in_stack_ffffffffffffff20;
  Vector3 *in_stack_ffffffffffffff28;
  Ray *in_stack_ffffffffffffff30;
  byte local_98;
  Ray *in_stack_ffffffffffffff90;
  World *in_stack_ffffffffffffff98;
  Collision *local_60;
  Vector3 local_40;
  Vector3 *local_20;
  double local_8;
  
  pVVar2 = &local_40;
  local_20 = in_RDX;
  operator-(in_stack_fffffffffffffef8,&in_stack_fffffffffffffef0->color);
  Vector3::dot(pVVar2,local_20);
  iVar1 = sign((EVP_PKEY_CTX *)pVVar2,(uchar *)local_20,siglen,in_RCX,in_R8);
  if ((double)iVar1 < 1e-05) {
    local_8 = 0.0;
    goto LAB_00125076;
  }
  Ray::Ray(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  findNearestPrimitive(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Ray::~Ray((Ray *)in_stack_fffffffffffffef0);
  if ((local_98 & 1) == 0) {
LAB_00125050:
    local_8 = 1.0;
    local_60 = in_stack_fffffffffffffef0;
  }
  else {
    pVVar2 = &local_40;
    Vector3::len((Vector3 *)0x124fc0);
    iVar1 = sign((EVP_PKEY_CTX *)pVVar2,in_RDI,siglen_00,in_RCX,in_R8);
    in_stack_fffffffffffffef0 = local_60;
    if (-1 < iVar1) goto LAB_00125050;
    local_8 = 0.0;
  }
  Collision::~Collision(local_60);
LAB_00125076:
  Vector3::~Vector3(&local_40);
  return local_8;
}

Assistant:

double World::getRadianceWithLight(const Vector3 &P, const Vector3 &N, const Vector3 &O)
{
    Vector3 L = (O - P);
    if (sign(L.dot(N)) < EPS) return 0;
    Collision collision = findNearestPrimitive(Ray(P, L));
    if (collision.crash && sign(collision.dist - L.len()) < 0) return 0;
    else return 1;
}